

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rfc5444_writer.c
# Opt level: O2

void rfc5444_writer_unregister_pkthandler(rfc5444_writer *writer,rfc5444_writer_pkthandler *pkt)

{
  list_entity *plVar1;
  list_entity *plVar2;
  
  if (writer->_state == RFC5444_WRITER_NONE) {
    plVar1 = (pkt->_pkthandle_node).next;
    if ((plVar1 != (list_entity *)0x0) &&
       (plVar2 = (pkt->_pkthandle_node).prev, plVar2 != (list_entity *)0x0)) {
      plVar2->next = plVar1;
      plVar1->prev = plVar2;
      (pkt->_pkthandle_node).next = (list_entity *)0x0;
      (pkt->_pkthandle_node).prev = (list_entity *)0x0;
    }
    return;
  }
  __assert_fail("writer->_state == RFC5444_WRITER_NONE",
                "/workspace/llm4binary/github/license_c_cmakelists/OLSR[P]OONF/src/librfc5444/rfc5444_writer.c"
                ,0x20b,
                "void rfc5444_writer_unregister_pkthandler(struct rfc5444_writer *, struct rfc5444_writer_pkthandler *)"
               );
}

Assistant:

void
rfc5444_writer_unregister_pkthandler(
  struct rfc5444_writer *writer __attribute__((unused)), struct rfc5444_writer_pkthandler *pkt) {
#if WRITER_STATE_MACHINE == true
  assert(writer->_state == RFC5444_WRITER_NONE);
#endif
  if (list_is_node_added(&pkt->_pkthandle_node)) {
    list_remove(&pkt->_pkthandle_node);
  }
}